

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

void skip(char **date)

{
  ushort **ppuVar1;
  bool bVar2;
  char **date_local;
  
  while( true ) {
    bVar2 = false;
    if (**date != '\0') {
      ppuVar1 = __ctype_b_loc();
      bVar2 = ((*ppuVar1)[(int)(uint)(byte)**date] & 8) == 0;
    }
    if (!bVar2) break;
    *date = *date + 1;
  }
  return;
}

Assistant:

static int
skip(struct archive_read *a)
{
	struct mtree *mtree;

	mtree = (struct mtree *)(a->format->data);
	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}
	return (ARCHIVE_OK);
}